

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subst.c
# Opt level: O2

void cleanup_substitution(bsdtar *bsdtar)

{
  substitution *__ptr;
  subst_rule *__ptr_00;
  
  __ptr = bsdtar->substitution;
  if (__ptr != (substitution *)0x0) {
    while (__ptr_00 = __ptr->first_rule, __ptr_00 != (subst_rule *)0x0) {
      __ptr->first_rule = __ptr_00->next;
      free(__ptr_00->result);
      free(__ptr_00);
    }
    free(__ptr);
    return;
  }
  return;
}

Assistant:

void
cleanup_substitution(struct bsdtar *bsdtar)
{
	struct subst_rule *rule;
	struct substitution *subst;

	if ((subst = bsdtar->substitution) == NULL)
		return;

	while ((rule = subst->first_rule) != NULL) {
		subst->first_rule = rule->next;
		free(rule->result);
		free(rule);
	}
	free(subst);
}